

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::ArgConverter<void>,_void> *this,Arg *arg)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  LongLong LVar4;
  LongLong *pLVar5;
  uint *puVar6;
  
  switch(arg->type) {
  case INT:
  case UINT:
  case CHAR:
    iVar1 = (arg->super_Value).field_0.int_value;
    piVar3 = *(int **)this;
    piVar3[4] = (*(int *)(this + 8) == 100 || *(int *)(this + 8) == 0x69) ^ 3;
    *piVar3 = iVar1;
    break;
  case LONG_LONG:
  case ULONG_LONG:
    LVar4 = (arg->super_Value).field_0.long_long_value;
    pLVar5 = *(LongLong **)this;
    *(uint *)(pLVar5 + 2) = (*(int *)(this + 8) == 100 || *(int *)(this + 8) == 0x69) ^ 5;
    *pLVar5 = LVar4;
    return;
  case BOOL:
    iVar1 = *(int *)(this + 8);
    if (iVar1 != 0x73) {
      iVar2 = (arg->super_Value).field_0.int_value;
      puVar6 = *(uint **)this;
      puVar6[4] = (iVar1 == 100 || iVar1 == 0x69) ^ 3;
      *puVar6 = (uint)(iVar2 != 0);
      return;
    }
  }
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }